

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

uint __thiscall
Imath_2_5::Box<Imath_2_5::Vec4<short>_>::majorAxis(Box<Imath_2_5::Vec4<short>_> *this)

{
  short sVar1;
  uint uVar2;
  short *psVar3;
  uint i;
  Vec4<short> s;
  uint major;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar4;
  uint i_00;
  undefined4 in_stack_ffffffffffffffec;
  uint local_c;
  
  local_c = 0;
  size((Box<Imath_2_5::Vec4<short>_> *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
      );
  uVar4 = 1;
  while( true ) {
    i_00 = uVar4;
    uVar2 = Vec4<short>::dimensions();
    if (uVar2 <= uVar4) break;
    psVar3 = Vec4<short>::operator[]((Vec4<short> *)&stack0xffffffffffffffec,i_00);
    sVar1 = *psVar3;
    psVar3 = Vec4<short>::operator[]((Vec4<short> *)&stack0xffffffffffffffec,local_c);
    if (*psVar3 < sVar1) {
      local_c = i_00;
    }
    uVar4 = i_00 + 1;
  }
  return local_c;
}

Assistant:

inline unsigned int
Box<T>::majorAxis() const
{
    unsigned int major = 0;
    T s = size();

    for (unsigned int i = 1; i < min.dimensions(); i++)
    {
	if (s[i] > s[major])
	    major = i;
    }

    return major;
}